

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O2

void __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Template_*,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::init_data(Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Template_*,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *this,size_t max_elements)

{
  size_t maxNumElementsAllowed;
  ulong uVar1;
  void *t;
  Node *pNVar2;
  ulong uVar3;
  long lVar4;
  
  this->mNumElements = 0;
  this->mMask = max_elements - 1;
  if (max_elements < 0x28f5c28f5c28f5d) {
    uVar1 = (max_elements * 0x50) / 100;
  }
  else {
    uVar1 = (max_elements / 100) * 0x50;
  }
  uVar3 = 0xff;
  if (uVar1 < 0xff) {
    uVar3 = uVar1;
  }
  this->mMaxNumElementsAllowed = uVar1;
  lVar4 = uVar3 + max_elements;
  t = calloc(1,lVar4 * 0x29 + 8);
  pNVar2 = (Node *)assertNotNull<std::bad_alloc,void>(t);
  this->mKeyVals = pNVar2;
  this->mInfo = (uint8_t *)(pNVar2 + lVar4);
  *(undefined1 *)((long)&pNVar2[lVar4].mData.first._M_dataplus._M_p + lVar4) = 1;
  this->mInfoInc = 0x20;
  this->mInfoHashShift = 0;
  return;
}

Assistant:

void init_data(size_t max_elements) {
        mNumElements = 0;
        mMask = max_elements - 1;
        mMaxNumElementsAllowed = calcMaxNumElementsAllowed(max_elements);

        auto const numElementsWithBuffer = calcNumElementsWithBuffer(max_elements);

        // calloc also zeroes everything
        mKeyVals = reinterpret_cast<Node*>(detail::assertNotNull<std::bad_alloc>(
            std::calloc(1, calcNumBytesTotal(numElementsWithBuffer))));
        mInfo = reinterpret_cast<uint8_t*>(mKeyVals + numElementsWithBuffer);

        // set sentinel
        mInfo[numElementsWithBuffer] = 1;

        mInfoInc = InitialInfoInc;
        mInfoHashShift = InitialInfoHashShift;
    }